

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O2

void convert_digit_pron(char **list,NJDNode *node)

{
  int iVar1;
  char *__s2;
  ulong uVar2;
  
  __s2 = NJDNode_get_string(node);
  if ((*__s2 != '*') || (__s2[1] != '\0')) {
    for (uVar2 = 0; list[uVar2] != (char *)0x0; uVar2 = uVar2 + 4) {
      iVar1 = strcmp(list[uVar2],__s2);
      if (iVar1 == 0) {
        uVar2 = uVar2 & 0xffffffff;
        NJDNode_set_pron(node,list[uVar2 + 1]);
        iVar1 = atoi(list[uVar2 + 2]);
        NJDNode_set_acc(node,iVar1);
        iVar1 = atoi(list[uVar2 + 3]);
        NJDNode_set_mora_size(node,iVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void convert_digit_pron(const char *list[], NJDNode * node)
{
   int i;
   const char *str = NJDNode_get_string(node);

   if (strcmp(str, "*") == 0)
      return;
   for (i = 0; list[i] != NULL; i += 4) {
      if (strcmp(list[i], str) == 0) {
         NJDNode_set_pron(node, (char *) list[i + 1]);
         NJDNode_set_acc(node, atoi(list[i + 2]));
         NJDNode_set_mora_size(node, atoi(list[i + 3]));
         return;
      }
   }
}